

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_3a70a8::BinaryExpr::printLeft(BinaryExpr *this,OutputStream *S)

{
  bool bVar1;
  StringView R;
  StringView R_00;
  StringView R_01;
  StringView R_02;
  StringView R_03;
  StringView R_04;
  StringView local_38;
  
  local_38.First = ">";
  local_38.Last = "";
  bVar1 = ::operator==(&this->InfixOperator,&local_38);
  if (bVar1) {
    R.Last = "";
    R.First = "(";
    OutputStream::operator+=(S,R);
  }
  R_00.Last = "";
  R_00.First = "(";
  OutputStream::operator+=(S,R_00);
  Node::print(this->LHS,S);
  R_01.Last = "";
  R_01.First = ") ";
  OutputStream::operator+=(S,R_01);
  OutputStream::operator+=(S,this->InfixOperator);
  R_02.Last = "";
  R_02.First = " (";
  OutputStream::operator+=(S,R_02);
  Node::print(this->RHS,S);
  R_03.Last = "";
  R_03.First = ")";
  OutputStream::operator+=(S,R_03);
  local_38.First = ">";
  local_38.Last = "";
  bVar1 = ::operator==(&this->InfixOperator,&local_38);
  if (bVar1) {
    R_04.Last = "";
    R_04.First = ")";
    OutputStream::operator+=(S,R_04);
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    // might be a template argument expression, then we need to disambiguate
    // with parens.
    if (InfixOperator == ">")
      S += "(";

    S += "(";
    LHS->print(S);
    S += ") ";
    S += InfixOperator;
    S += " (";
    RHS->print(S);
    S += ")";

    if (InfixOperator == ">")
      S += ")";
  }